

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O1

uint8_t * __thiscall DTSStreamReader::findFrame(DTSStreamReader *this,uint8_t *buff,uint8_t *end)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  char cVar4;
  uint8_t *p_buf;
  ulong uVar5;
  uint8_t *puVar6;
  uint64_t local_38;
  
  do {
    uVar5 = (long)end - (long)buff;
    if ((long)uVar5 < 0x10) goto LAB_00183ab2;
    local_38 = *(uint64_t *)buff;
    uVar1 = my_ntohll(&local_38);
    local_38 = *(uint64_t *)((long)buff + 8);
    uVar2 = my_ntohll(&local_38);
    uVar3 = uVar2 + 0x10;
    cVar4 = '\x03';
    if (uVar3 < 0x2000000000000001) {
      if ((long)uVar1 < 0x434f524553534d44) {
        if ((long)uVar1 < 0x424c41434b4f5554) {
          if (uVar1 == 0x415550522d484452) {
            cVar4 = '\x01';
            if ((uint64_t *)(uVar3 + (long)buff) <= end) {
              this->m_skippingSamples =
                   (uint)(ushort)(*(ushort *)((long)buff + 0x23) << 8 |
                                 *(ushort *)((long)buff + 0x23) >> 8);
              cVar4 = '\0';
              buff = (uint8_t *)(uVar3 + (long)buff);
            }
            goto LAB_00183a6f;
          }
          if (uVar1 != 0x41555052494e464f) {
            uVar2 = 0x4249545348565442;
            goto LAB_00183a59;
          }
        }
        else if ((uVar1 != 0x424c41434b4f5554) && (uVar1 != 0x4252414e43485054)) {
          uVar2 = 0x4255494c44564552;
          goto LAB_00183a59;
        }
      }
      else {
        if ((long)uVar1 < 0x46494c45494e464f) {
          if ((uVar1 == 0x434f524553534d44) || (uVar1 == 0x4454534844484452)) goto LAB_00183a5e;
          uVar2 = 0x45585453535f4d44;
        }
        else if ((long)uVar1 < 0x5354524d44415441) {
          if (uVar1 == 0x46494c45494e464f) goto LAB_00183a5e;
          uVar2 = 0x4e4156492d54424c;
        }
        else {
          if (uVar1 == 0x5354524d44415441) {
            buff = (uint8_t *)((long)buff + 0x10);
            goto LAB_00183a6f;
          }
          uVar2 = 0x54494d45434f4445;
        }
LAB_00183a59:
        if (uVar1 != uVar2) goto LAB_00183a6f;
      }
LAB_00183a5e:
      cVar4 = uVar5 < uVar3;
      if (uVar5 < uVar3) {
        uVar3 = 0;
      }
      buff = (uint8_t *)((long)buff + uVar3);
    }
LAB_00183a6f:
  } while (cVar4 == '\0');
  if (cVar4 != '\x01') {
LAB_00183ab2:
    if (this->m_firstCall == true) {
      this->m_firstCall = false;
      checkIfOnlyHDDataExists(this,buff,end);
    }
    if (this->m_isCoreExists == false) {
      if (buff < end + -4) {
        puVar6 = end + (-4 - (long)buff);
        do {
          if (((((uint8_t)*(uint64_t *)buff == 'd') && (*(uint8_t *)((long)buff + 1) == 'X')) &&
              (*(uint8_t *)((long)buff + 2) == ' ')) && (*(uint8_t *)((long)buff + 3) == '%')) {
            return (uint8_t *)(uint64_t *)buff;
          }
          buff = (uint8_t *)((long)buff + 1);
          puVar6 = puVar6 + -1;
        } while (puVar6 != (uint8_t *)0x0);
      }
    }
    else if (buff < end + -4) {
      puVar6 = end + (-4 - (long)buff);
      do {
        if (buff < end + -6) {
          if ((uint8_t)*(uint64_t *)buff == '\x1f') {
            if (((*(uint8_t *)((long)buff + 1) == 0xff) && (*(uint8_t *)((long)buff + 2) == 0xe8))
               && ((*(uint8_t *)((long)buff + 3) == '\0' &&
                   ((*(uint8_t *)((long)buff + 4) == '\a' && (0xef < *(byte *)((long)buff + 5)))))))
            {
              return (uint8_t *)(uint64_t *)buff;
            }
          }
          else if ((((((uint8_t)*(uint64_t *)buff == 0xff) &&
                     (*(uint8_t *)((long)buff + 1) == '\x1f')) &&
                    (*(uint8_t *)((long)buff + 2) == '\0')) &&
                   ((*(uint8_t *)((long)buff + 3) == 0xe8 && (0xef < *(byte *)((long)buff + 4)))))
                  && (*(uint8_t *)((long)buff + 5) == '\a')) {
            return (uint8_t *)(uint64_t *)buff;
          }
        }
        buff = (uint8_t *)((long)buff + 1);
        puVar6 = puVar6 + -1;
      } while (puVar6 != (uint8_t *)0x0);
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* DTSStreamReader::findFrame(uint8_t* buff, uint8_t* end)
{
    // check for DTS-HD headers
    while (end - buff >= 16)
    {
        const auto ptr = reinterpret_cast<int64_t*>(buff);
        const uint64_t hdrType = my_ntohll(ptr[0]);
        const uint64_t hdrSize = my_ntohll(ptr[1]) + 16;

        if (hdrSize > static_cast<uint64_t>(1) << 61)
            break;

        if (hdrType == AUPRINFO || hdrType == BITSHVTB || hdrType == BLACKOUT || hdrType == BRANCHPT ||
            hdrType == BUILDVER || hdrType == CORESSMD || hdrType == EXTSS_MD || hdrType == FILEINFO ||
            hdrType == NAVI_TBL || hdrType == TIMECODE || hdrType == DTSHDHDR)
        {
            if (hdrSize > static_cast<size_t>(end - buff))
                return nullptr;  // need more data
            buff += hdrSize;
        }
        else if (hdrType == AUPR_HDR)
        {
            if (buff + hdrSize > end)
                return nullptr;  // need more data
            // determine skipping frames amount
            m_skippingSamples = (buff[35] << 8) + buff[36];
            buff += hdrSize;
        }
        else if (hdrType == STRMDATA)
        {
            // m_dataSegmentLen = hdrSize;
            buff += 16;
            break;
        }
        else
        {
            break;  // no more HD headers
        }
    }

    if (m_firstCall)
    {
        m_firstCall = false;
        checkIfOnlyHDDataExists(buff, end);
    }

    if (!m_isCoreExists)
    {
        // if not core exists find HD frames directly
        for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
        {
            if (p_buf[0] == 0x64 && p_buf[1] == 0x58 && p_buf[2] == 0x20 && p_buf[3] == 0x25)
            {
                return p_buf;
            }
        }
        return nullptr;
    }

    for (uint8_t* p_buf = buff; p_buf < end - 4; p_buf++)
    {
        if (p_buf < end - 6)
        {
            if (p_buf[0] == 0xff && p_buf[1] == 0x1f && p_buf[2] == 0x00 && p_buf[3] == 0xe8 &&
                (p_buf[4] & 0xf0) == 0xf0 && p_buf[5] == 0x07)
            {
                return p_buf;
            }
            // 14 bits, big endian version of the bitstream
            if (p_buf[0] == 0x1f && p_buf[1] == 0xff && p_buf[2] == 0xe8 && p_buf[3] == 0x00 && p_buf[4] == 0x07 &&
                (p_buf[5] & 0xf0) == 0xf0)
            {
                return p_buf;
            }
        }
        // 16 bits, big endian version of the bitstream
        if (p_buf[0] == 0x7f && p_buf[1] == 0xfe && p_buf[2] == 0x80 && p_buf[3] == 0x01)
        {
            return p_buf;
        }
        // 16 bits, little endian version of the bitstream
        if (p_buf[0] == 0xfe && p_buf[1] == 0x7f && p_buf[2] == 0x01 && p_buf[3] == 0x80)
        {
            return p_buf;
        }
    }
    return nullptr;
}